

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O0

QItemSelection * mergeIndexes(QList<QPersistentModelIndex> *indexes)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  qsizetype qVar4;
  QItemSelectionRange *this;
  const_reference pQVar5;
  QModelIndex *topL;
  QList<QPersistentModelIndex> *in_RSI;
  QItemSelection *in_RDI;
  long in_FS_OFFSET;
  int nextColumn;
  int nextRow;
  QPersistentModelIndex *next;
  int brColumn;
  int brRow;
  QPersistentModelIndex *tl;
  int i;
  QItemSelection *rowSpans;
  QModelIndex nextBr;
  QModelIndex nextTl;
  QModelIndex prevTl;
  QModelIndex br_1;
  QModelIndex tl_1;
  QModelIndex nextParent;
  QModelIndex brParent;
  QPersistentModelIndex br;
  QItemSelection colSpans;
  QModelIndex *in_stack_fffffffffffffdc8;
  QModelIndex *in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffddc;
  int in_stack_fffffffffffffde0;
  int in_stack_fffffffffffffde4;
  QModelIndex *in_stack_fffffffffffffde8;
  QItemSelectionRange *in_stack_fffffffffffffdf0;
  int local_1ac;
  int local_1a8;
  int local_18c;
  undefined1 *local_138;
  undefined1 *puStack_130;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_128;
  undefined1 *local_118;
  undefined1 *puStack_110;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_f0;
  undefined1 *local_e8;
  undefined1 *puStack_e0;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_d8;
  undefined1 *local_c8;
  undefined1 *puStack_c0;
  QAbstractItemModel *local_b8;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  undefined1 *local_28;
  QList<QItemSelectionRange> local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_20.d.ptr = (QItemSelectionRange *)&DAT_aaaaaaaaaaaaaaaa;
  local_20.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QItemSelection::QItemSelection((QItemSelection *)0x82ae0f);
  local_18c = 0;
LAB_0082ae1a:
  do {
    qVar4 = QList<QPersistentModelIndex>::size(in_RSI);
    if (qVar4 <= local_18c) {
      (in_RDI->super_QList<QItemSelectionRange>).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      (in_RDI->super_QList<QItemSelectionRange>).d.ptr =
           (QItemSelectionRange *)&DAT_aaaaaaaaaaaaaaaa;
      (in_RDI->super_QList<QItemSelectionRange>).d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      QItemSelection::QItemSelection((QItemSelection *)0x82b1fc);
      local_18c = 0;
      do {
        this = (QItemSelectionRange *)(long)local_18c;
        qVar4 = QList<QItemSelectionRange>::size(&local_20);
        if (qVar4 <= (long)this) {
          QItemSelection::~QItemSelection((QItemSelection *)0x82b61a);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
            return in_RDI;
          }
          __stack_chk_fail();
        }
        local_c8 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_c0 = &DAT_aaaaaaaaaaaaaaaa;
        local_b8 = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        pQVar5 = QList<QItemSelectionRange>::at
                           ((QList<QItemSelectionRange> *)in_stack_fffffffffffffdd0,
                            (qsizetype)in_stack_fffffffffffffdc8);
        QItemSelectionRange::topLeft(pQVar5);
        QPersistentModelIndex::operator_cast_to_QModelIndex
                  ((QPersistentModelIndex *)
                   CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
        local_e8 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_e0 = &DAT_aaaaaaaaaaaaaaaa;
        local_d8.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        pQVar5 = QList<QItemSelectionRange>::at
                           ((QList<QItemSelectionRange> *)in_stack_fffffffffffffdd0,
                            (qsizetype)in_stack_fffffffffffffdc8);
        QItemSelectionRange::bottomRight(pQVar5);
        QPersistentModelIndex::operator_cast_to_QModelIndex
                  ((QPersistentModelIndex *)
                   CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
        local_100 = local_c8;
        local_f8 = puStack_c0;
        local_f0.ptr = local_b8;
        while( true ) {
          local_18c = local_18c + 1;
          topL = (QModelIndex *)(long)local_18c;
          qVar4 = QList<QItemSelectionRange>::size(&local_20);
          if (qVar4 <= (long)topL) break;
          local_118 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_110 = &DAT_aaaaaaaaaaaaaaaa;
          local_108.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
          pQVar5 = QList<QItemSelectionRange>::at
                             ((QList<QItemSelectionRange> *)in_stack_fffffffffffffdd0,
                              (qsizetype)in_stack_fffffffffffffdc8);
          QItemSelectionRange::topLeft(pQVar5);
          QPersistentModelIndex::operator_cast_to_QModelIndex
                    ((QPersistentModelIndex *)
                     CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
          local_138 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_130 = &DAT_aaaaaaaaaaaaaaaa;
          local_128.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
          pQVar5 = QList<QItemSelectionRange>::at
                             ((QList<QItemSelectionRange> *)in_stack_fffffffffffffdd0,
                              (qsizetype)in_stack_fffffffffffffdc8);
          QItemSelectionRange::bottomRight(pQVar5);
          QPersistentModelIndex::operator_cast_to_QModelIndex
                    ((QPersistentModelIndex *)
                     CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
          QModelIndex::parent((QModelIndex *)
                              CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
          QModelIndex::parent((QModelIndex *)
                              CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
          bVar1 = operator!=(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
          if (bVar1) break;
          in_stack_fffffffffffffde4 = QModelIndex::column((QModelIndex *)&local_118);
          iVar2 = QModelIndex::column((QModelIndex *)&local_100);
          if (in_stack_fffffffffffffde4 != iVar2) break;
          in_stack_fffffffffffffde0 = QModelIndex::column((QModelIndex *)&local_138);
          iVar2 = QModelIndex::column((QModelIndex *)&local_e8);
          if (in_stack_fffffffffffffde0 != iVar2) break;
          iVar2 = QModelIndex::row((QModelIndex *)&local_118);
          iVar3 = QModelIndex::row((QModelIndex *)&local_100);
          if (iVar2 != iVar3 + 1) break;
          iVar2 = QModelIndex::row((QModelIndex *)&local_138);
          iVar3 = QModelIndex::row((QModelIndex *)&local_e8);
          if (iVar2 != iVar3 + 1) break;
          local_e8 = local_138;
          puStack_e0 = puStack_130;
          local_d8.ptr = local_128.ptr;
          local_100 = local_118;
          local_f8 = puStack_110;
          local_f0.ptr = local_108.ptr;
        }
        QItemSelectionRange::QItemSelectionRange
                  (this,topL,
                   (QModelIndex *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
        QList<QItemSelectionRange>::append
                  ((QList<QItemSelectionRange> *)in_stack_fffffffffffffdd0,
                   (rvalue_ref)in_stack_fffffffffffffdc8);
        QItemSelectionRange::~QItemSelectionRange((QItemSelectionRange *)in_stack_fffffffffffffdd0);
      } while( true );
    }
    QList<QPersistentModelIndex>::at
              ((QList<QPersistentModelIndex> *)in_stack_fffffffffffffdd0,
               (qsizetype)in_stack_fffffffffffffdc8);
    bVar1 = QPersistentModelIndex::isValid((QPersistentModelIndex *)in_stack_fffffffffffffdd0);
    if (!bVar1) {
      local_18c = local_18c + 1;
      goto LAB_0082ae1a;
    }
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    QPersistentModelIndex::QPersistentModelIndex
              ((QPersistentModelIndex *)in_stack_fffffffffffffdd0,
               (QPersistentModelIndex *)in_stack_fffffffffffffdc8);
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    QPersistentModelIndex::parent
              ((QPersistentModelIndex *)
               CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
    local_1a8 = QPersistentModelIndex::row((QPersistentModelIndex *)in_stack_fffffffffffffdc8);
    local_1ac = QPersistentModelIndex::column((QPersistentModelIndex *)in_stack_fffffffffffffdc8);
    while( true ) {
      local_18c = local_18c + 1;
      qVar4 = QList<QPersistentModelIndex>::size(in_RSI);
      if (qVar4 <= local_18c) break;
      QList<QPersistentModelIndex>::at
                ((QList<QPersistentModelIndex> *)in_stack_fffffffffffffdd0,
                 (qsizetype)in_stack_fffffffffffffdc8);
      bVar1 = QPersistentModelIndex::isValid((QPersistentModelIndex *)in_stack_fffffffffffffdd0);
      if (bVar1) {
        local_68 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
        local_58 = &DAT_aaaaaaaaaaaaaaaa;
        QPersistentModelIndex::parent
                  ((QPersistentModelIndex *)
                   CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
        iVar2 = QPersistentModelIndex::row((QPersistentModelIndex *)in_stack_fffffffffffffdc8);
        iVar3 = QPersistentModelIndex::column((QPersistentModelIndex *)in_stack_fffffffffffffdc8);
        bVar1 = operator==(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
        if (((!bVar1) || (iVar2 != local_1a8)) || (iVar3 != local_1ac + 1)) break;
        QPersistentModelIndex::operator=
                  ((QPersistentModelIndex *)
                   CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
                   (QPersistentModelIndex *)in_stack_fffffffffffffdd0);
        local_48 = local_68;
        puStack_40 = puStack_60;
        local_38 = local_58;
        local_1ac = iVar3;
        local_1a8 = iVar2;
      }
    }
    QPersistentModelIndex::operator_cast_to_QModelIndex
              ((QPersistentModelIndex *)
               CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
    QPersistentModelIndex::operator_cast_to_QModelIndex
              ((QPersistentModelIndex *)
               CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
    QItemSelectionRange::QItemSelectionRange
              (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
               (QModelIndex *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
    QList<QItemSelectionRange>::append
              ((QList<QItemSelectionRange> *)in_stack_fffffffffffffdd0,
               (rvalue_ref)in_stack_fffffffffffffdc8);
    QItemSelectionRange::~QItemSelectionRange((QItemSelectionRange *)in_stack_fffffffffffffdd0);
    QPersistentModelIndex::~QPersistentModelIndex
              ((QPersistentModelIndex *)in_stack_fffffffffffffdd0);
  } while( true );
}

Assistant:

static QItemSelection mergeIndexes(const QList<QPersistentModelIndex> &indexes)
{
    QItemSelection colSpans;
    // merge columns
    int i = 0;
    while (i < indexes.size()) {
        const QPersistentModelIndex &tl = indexes.at(i);
        if (!tl.isValid()) {
            ++i;
            continue;
        }
        QPersistentModelIndex br = tl;
        QModelIndex brParent = br.parent();
        int brRow = br.row();
        int brColumn = br.column();
        while (++i < indexes.size()) {
            const QPersistentModelIndex &next = indexes.at(i);
            if (!next.isValid())
                continue;
            const QModelIndex nextParent = next.parent();
            const int nextRow = next.row();
            const int nextColumn = next.column();
            if ((nextParent == brParent)
                 && (nextRow == brRow)
                 && (nextColumn == brColumn + 1)) {
                br = next;
                brParent = nextParent;
                brRow = nextRow;
                brColumn = nextColumn;
            } else {
                break;
            }
        }
        colSpans.append(QItemSelectionRange(tl, br));
    }
    // merge rows
    QItemSelection rowSpans;
    i = 0;
    while (i < colSpans.size()) {
        QModelIndex tl = colSpans.at(i).topLeft();
        QModelIndex br = colSpans.at(i).bottomRight();
        QModelIndex prevTl = tl;
        while (++i < colSpans.size()) {
            QModelIndex nextTl = colSpans.at(i).topLeft();
            QModelIndex nextBr = colSpans.at(i).bottomRight();

            if (nextTl.parent() != tl.parent())
                break; // we can't merge selection ranges from different parents

            if ((nextTl.column() == prevTl.column()) && (nextBr.column() == br.column())
                && (nextTl.row() == prevTl.row() + 1) && (nextBr.row() == br.row() + 1)) {
                br = nextBr;
                prevTl = nextTl;
            } else {
                break;
            }
        }
        rowSpans.append(QItemSelectionRange(tl, br));
    }
    return rowSpans;
}